

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

void __thiscall mario::TimerQueue::cancel(TimerQueue *this,TimerId timerId)

{
  EventLoop *this_00;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  this_00 = this->_loop;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x28);
  *(code **)local_48._M_unused._0_8_ = cancelInLoop;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(Timer **)((long)local_48._M_unused._0_8_ + 0x10) = timerId._value;
  *(int64_t *)((long)local_48._M_unused._0_8_ + 0x18) = timerId._seq;
  *(TimerQueue **)((long)local_48._M_unused._0_8_ + 0x20) = this;
  pcStack_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*,_mario::TimerId))(mario::TimerId)>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*,_mario::TimerId))(mario::TimerId)>_>
             ::_M_manager;
  EventLoop::runInLoop(this_00,(Functor *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void TimerQueue::cancel(TimerId timerId) {
    _loop->runInLoop(
            std::bind(&TimerQueue::cancelInLoop, this, timerId)
            );
}